

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

optional<long> slang::parseInt<long>(string_view name,string_view value,string *error)

{
  bool bVar1;
  long *__t;
  size_type sVar2;
  const_pointer pvVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  __integer_from_chars_result_type<long> _Var5;
  optional<long> oVar6;
  __integer_from_chars_result_type<long> result;
  const_pointer end;
  long val;
  undefined1 in_stack_000000d0 [16];
  undefined1 in_stack_000000e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe78;
  basic_string_view<char,_std::char_traits<char>_> *x;
  value<fmt::v11::context> *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  long *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined1 local_130 [40];
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [16];
  _Storage<long,_true> local_e8;
  undefined1 local_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  char *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_108);
  if (bVar1) {
    pcVar7 = "expected value for argument \'{}\'";
    local_90 = local_130;
    local_a0 = "expected value for argument \'{}\'";
    local_98 = 0x20;
    local_a8 = local_f8;
    local_b8 = "expected value for argument \'{}\'";
    local_b0 = 0x20;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_8 = &local_c8;
    local_10 = local_d8;
    local_c8 = 0xd;
    local_c0 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000e0,(format_args)in_stack_000000d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7,
               in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(in_stack_fffffffffffffe70);
    std::optional<long>::optional((optional<long> *)0x5a0b64);
    uVar4 = extraout_RDX;
  }
  else {
    __t = (long *)std::basic_string_view<char,_std::char_traits<char>_>::data(&local_108);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_108);
    pvVar3 = (const_pointer)((long)__t + sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_108);
    _Var5 = std::from_chars<long>
                      (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
                       ,in_stack_fffffffffffffe8c);
    if ((_Var5.ec == 0) && (_Var5.ptr == pvVar3)) {
      std::optional<long>::optional<long,_true>((optional<long> *)in_stack_fffffffffffffe70,__t);
      uVar4 = extraout_RDX_01;
    }
    else {
      pcVar7 = "invalid value \'{}\' for integer argument \'{}\'";
      x = (basic_string_view<char,_std::char_traits<char>_> *)0x2c;
      local_28 = &stack0xfffffffffffffe80;
      local_38 = "invalid value \'{}\' for integer argument \'{}\'";
      local_30 = 0x2c;
      local_40 = &local_108;
      local_48 = local_f8;
      local_58 = "invalid value \'{}\' for integer argument \'{}\'";
      local_50 = 0x2c;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                (in_stack_fffffffffffffe80,(basic_string_view<char,_std::char_traits<char>_> *)0x2c)
      ;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                (in_stack_fffffffffffffe80,x);
      local_18 = &local_68;
      local_20 = local_88;
      local_68 = 0xdd;
      local_60 = local_20;
      ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000e0,(format_args)in_stack_000000d0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      std::optional<long>::optional((optional<long> *)0x5a0d12);
      uVar4 = extraout_RDX_00;
    }
  }
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)uVar4 >> 8);
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = (bool)local_e0;
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = local_e8._M_value;
  return (optional<long>)
         oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

static std::optional<T> parseInt(std::string_view name, std::string_view value,
                                 std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}